

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O1

enable_if_t<HasSize<vector<AnimatedShapeSceneEntity>_>::value_&&_HasData<vector<AnimatedShapeSceneEntity>_>::value,_std::ostream_&>
 pbrt::detail::operator<<
           (ostream *os,
           vector<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
           *v)

{
  ulong uVar1;
  pointer this;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[ ",2);
  this = (v->
         super__Vector_base<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
         )._M_impl.super__Vector_impl_data._M_start;
  if ((v->
      super__Vector_base<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
      )._M_impl.super__Vector_impl_data._M_finish != this) {
    uVar1 = 0;
    do {
      AnimatedShapeSceneEntity::ToString_abi_cxx11_(&local_50,this);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,local_50._M_dataplus._M_p,local_50._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (uVar1 < ((long)(v->
                         super__Vector_base<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(v->
                         super__Vector_base<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 4) * 0x4fbcda3ac10c9715 - 1U)
      {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      }
      uVar1 = uVar1 + 1;
      this = this + 1;
    } while (uVar1 < (ulong)(((long)(v->
                                    super__Vector_base<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(v->
                                    super__Vector_base<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 4) *
                            0x4fbcda3ac10c9715));
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," ]",2);
  return os;
}

Assistant:

inline std::enable_if_t<HasSize<T>::value && HasData<T>::value, std::ostream &>
operator<<(std::ostream &os, const T &v) {
    os << "[ ";
    auto ptr = v.data();
    for (size_t i = 0; i < v.size(); ++i) {
        os << ptr[i];
        if (i < v.size() - 1)
            os << ", ";
    }
    return os << " ]";
}